

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

uint32_t google::protobuf::compiler::cpp::anon_unknown_0::CalcFieldNum
                   (FieldGenerator *generator,FieldDescriptor *field,Options *options)

{
  byte bVar1;
  bool bVar2;
  Type type;
  int iVar3;
  uint32_t uVar4;
  OneofDescriptor *pOVar5;
  FieldTypeClass FStack_30;
  
  bVar1 = *(byte *)(*(long *)(*(long *)(field + 0x20) + 0x20) + 0x4b);
  type = FieldDescriptor::type(field);
  if ((type == TYPE_BYTES) || (type == TYPE_STRING)) {
    iVar3 = (*generator->_vptr_FieldGenerator[0x16])(generator);
    if ((char)iVar3 == '\0') {
      bVar2 = IsCord(field,options);
      if (bVar2) {
        type = MAX_TYPE|TYPE_DOUBLE;
      }
      else {
        bVar2 = IsStringPiece(field,options);
        if (bVar2) {
          type = TYPE_SFIXED64|TYPE_UINT64;
        }
      }
    }
    else {
      type = TYPE_SFIXED64|TYPE_INT32;
    }
  }
  pOVar5 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar5 == (OneofDescriptor *)0x0) {
    bVar2 = FieldDescriptor::is_packed(field);
    if (bVar2) {
      FStack_30 = kPacked;
    }
    else if ((~(byte)field[1] & 0x60) == 0) {
      FStack_30 = kRepeated;
    }
    else {
      bVar2 = HasHasbit(field);
      FStack_30 = kPresence;
      if (!bVar2) {
        pOVar5 = FieldDescriptor::real_containing_oneof(field);
        FStack_30 = (FieldTypeClass)(pOVar5 == (OneofDescriptor *)0x0 & (bVar1 ^ 1));
      }
    }
  }
  else {
    FStack_30 = kOneOf;
  }
  uVar4 = internal::FieldMetadata::CalculateType(type,FStack_30);
  return uVar4;
}

Assistant:

uint32_t CalcFieldNum(const FieldGenerator& generator,
                      const FieldDescriptor* field, const Options& options) {
  bool is_a_map = IsMapEntryMessage(field->containing_type());
  int type = field->type();
  if (type == FieldDescriptor::TYPE_STRING ||
      type == FieldDescriptor::TYPE_BYTES) {
    // string field
    if (generator.IsInlined()) {
      type = internal::FieldMetadata::kInlinedType;
    } else if (IsCord(field, options)) {
      type = internal::FieldMetadata::kCordType;
    } else if (IsStringPiece(field, options)) {
      type = internal::FieldMetadata::kStringPieceType;
    }
  }

  if (field->real_containing_oneof()) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kOneOf);
  } else if (field->is_packed()) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kPacked);
  } else if (field->is_repeated()) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kRepeated);
  } else if (HasHasbit(field) || field->real_containing_oneof() || is_a_map) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kPresence);
  } else {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kNoPresence);
  }
}